

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O2

void __thiscall ManyDoublesWriteTest::RunShard(ManyDoublesWriteTest *this,int shard)

{
  uint uVar1;
  uint uVar2;
  char *message;
  uint uVar3;
  uint uVar4;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  uint64_t them_bits;
  uint64_t bits;
  AssertHelper local_a8;
  char *endptr;
  char buffer [100];
  
  uVar3 = 0xffffffff;
  uVar1 = shard;
  uVar4 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 < uVar4) {
      if (shard == 0) {
        puts("done.");
        fflush(_stdout);
      }
      return;
    }
    if ((shard == 0) && (uVar2 >> 0x18 != uVar3)) {
      printf("value: 0x%08x (%d%%)\r",(ulong)uVar2,
             (ulong)(uint)(int)(((double)uVar2 * 100.0) / 4294967295.0));
      fflush(_stdout);
      uVar3 = uVar2 >> 0x18;
    }
    bits = (ulong)uVar2 * 0x100000001;
    if ((~uVar2 & 0x7ff00000) != 0) {
      wabt::WriteDoubleHex(buffer,100,bits);
      them_bits = (uint64_t)strtod(buffer,&endptr);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar,"bits","them_bits",&bits,&them_bits);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_c0);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-hexfloat.cc"
                   ,0xdd,message);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_c0);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        return;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
    uVar1 = (this->super_ThreadedTest).num_threads_ + uVar2;
    uVar4 = uVar2;
  } while( true );
}

Assistant:

virtual void RunShard(int shard) {
    char buffer[100];
    FOREACH_UINT32(halfbits) {
      LOG_COMPLETION(halfbits);
      uint64_t bits = (static_cast<uint64_t>(halfbits) << 32) | halfbits;
      if (is_infinity_or_nan(bits))
        continue;

      WriteDoubleHex(buffer, sizeof(buffer), bits);

      char* endptr;
      double them_double = strtod(buffer, &endptr);
      uint64_t them_bits = bit_cast<uint64_t>(them_double);
      ASSERT_EQ(bits, them_bits);
    }
    LOG_DONE();
  }